

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::iterate(FilterCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  MessageFilter *desc;
  value_type *__value;
  uchar *tbs;
  size_t tbslen;
  allocator<char> local_e9;
  string local_e8;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  refMessages;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  filteredMessages;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filters;
  MessageFilter baseFilter;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_48;
  long lVar5;
  
  bVar1 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  if (bVar1) {
    iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar5 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar5 + 0x5e0))(0x92e0);
    (**(code **)(lVar5 + 0x5e0))(0x8242);
    (**(code **)(lVar5 + 0x420))(BaseCase::callbackHandle,this);
    tbslen = 1;
    (**(code **)(lVar5 + 0x428))(0x1100,0x1100,0x1100,0,0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&baseFilter,"Reference run",(allocator<char> *)&local_e8);
    desc = &baseFilter;
    genMessages(&refMessages,this,true,(string *)desc);
    std::__cxx11::string::~string((string *)&baseFilter);
    local_e8._M_dataplus._M_p = (pointer)0x0;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    baseFilter.source = 0x1100;
    baseFilter.type = 0x1100;
    baseFilter.severity = 0x1100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&baseFilter.ids,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
    baseFilter.enabled = true;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_e8);
    dVar3 = deStringHash((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                         super_TestNode.m_name._M_dataplus._M_p);
    uVar4 = tcu::CommandLine::getBaseSeed
                      (((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_cmdLine);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
              *)&local_e8,(size_type)&baseFilter,__value,(allocator_type *)desc);
    tbs = (uchar *)(ulong)(uVar4 ^ dVar3);
    genFilters(&filters,this,&refMessages,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)&local_e8,uVar4 ^ dVar3,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)&local_e8);
    filteredMessages.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filteredMessages.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    filteredMessages.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    applyFilters(this,&filters);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Filtered run",&local_e9)
    ;
    genMessages(&local_48,this,false,&local_e8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::operator=(&filteredMessages,&local_48);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_48);
    std::__cxx11::string::~string((string *)&local_e8);
    verify(this,(EVP_PKEY_CTX *)&refMessages,(uchar *)&filteredMessages,(size_t)&filters,tbs,tbslen)
    ;
    bVar1 = BaseCase::isDebugContext(&this->super_BaseCase);
    if ((!bVar1) &&
       (refMessages.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        refMessages.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Verification accuracy is lacking without a debug context",
                 (allocator<char> *)&local_48);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&filteredMessages);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&filters);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&baseFilter.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&refMessages);
    (**(code **)(lVar5 + 0x4e8))(0x92e0);
    (**(code **)(lVar5 + 0x420))(0,0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_BaseCase).m_results,
               (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x3a6);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FilterCase::IterateResult FilterCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageCallback(callbackHandle, this);

	try
	{
		gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true);

		{
			const vector<MessageData>	refMessages		= genMessages(true, "Reference run");
			const MessageFilter			baseFilter		(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), true);
			const deUint32				baseSeed		= deStringHash(getName()) ^ m_testCtx.getCommandLine().getBaseSeed();
			const vector<MessageFilter>	filters			= genFilters(refMessages, vector<MessageFilter>(1, baseFilter), baseSeed, 4);
			vector<MessageData>			filteredMessages;

			applyFilters(filters);

			// Generate errors
			filteredMessages = genMessages(false, "Filtered run");

			// Verify
			verify(refMessages, filteredMessages, filters);

			if (!isDebugContext() && refMessages.empty())
				m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
		}
	}
	catch (...)
	{
		gl.disable(GL_DEBUG_OUTPUT);
		gl.debugMessageCallback(DE_NULL, DE_NULL);
		throw;
	}

	gl.disable(GL_DEBUG_OUTPUT);
	gl.debugMessageCallback(DE_NULL, DE_NULL);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}